

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

Calendar * icu_63::createStandardCalendar(ECalType calType,Locale *loc,UErrorCode *status)

{
  GregorianCalendar *pGVar1;
  GregorianCalendar *local_258;
  GregorianCalendar *local_248;
  GregorianCalendar *local_238;
  GregorianCalendar *local_228;
  GregorianCalendar *local_218;
  GregorianCalendar *local_208;
  GregorianCalendar *local_1f8;
  GregorianCalendar *local_1e8;
  GregorianCalendar *local_1d8;
  GregorianCalendar *local_1c8;
  GregorianCalendar *local_1b8;
  GregorianCalendar *local_1a8;
  GregorianCalendar *local_198;
  GregorianCalendar *local_188;
  GregorianCalendar *local_178;
  GregorianCalendar *local_168;
  GregorianCalendar *local_158;
  GregorianCalendar *local_28;
  Calendar *cal;
  UErrorCode *status_local;
  Locale *loc_local;
  ECalType calType_local;
  
  local_28 = (GregorianCalendar *)0x0;
  switch(calType) {
  case CALTYPE_GREGORIAN:
    pGVar1 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x290,(size_t)loc);
    local_158 = (GregorianCalendar *)0x0;
    if (pGVar1 != (GregorianCalendar *)0x0) {
      GregorianCalendar::GregorianCalendar(pGVar1,loc,status);
      local_158 = pGVar1;
    }
    local_28 = local_158;
    break;
  case CALTYPE_JAPANESE:
    pGVar1 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x290,(size_t)loc);
    local_168 = (GregorianCalendar *)0x0;
    if (pGVar1 != (GregorianCalendar *)0x0) {
      JapaneseCalendar::JapaneseCalendar((JapaneseCalendar *)pGVar1,loc,status);
      local_168 = pGVar1;
    }
    local_28 = local_168;
    break;
  case CALTYPE_BUDDHIST:
    pGVar1 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x290,(size_t)loc);
    local_178 = (GregorianCalendar *)0x0;
    if (pGVar1 != (GregorianCalendar *)0x0) {
      BuddhistCalendar::BuddhistCalendar((BuddhistCalendar *)pGVar1,loc,status);
      local_178 = pGVar1;
    }
    local_28 = local_178;
    break;
  case CALTYPE_ROC:
    pGVar1 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x290,(size_t)loc);
    local_188 = (GregorianCalendar *)0x0;
    if (pGVar1 != (GregorianCalendar *)0x0) {
      TaiwanCalendar::TaiwanCalendar((TaiwanCalendar *)pGVar1,loc,status);
      local_188 = pGVar1;
    }
    local_28 = local_188;
    break;
  case CALTYPE_PERSIAN:
    pGVar1 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x268,(size_t)loc);
    local_198 = (GregorianCalendar *)0x0;
    if (pGVar1 != (GregorianCalendar *)0x0) {
      PersianCalendar::PersianCalendar((PersianCalendar *)pGVar1,loc,status);
      local_198 = pGVar1;
    }
    local_28 = local_198;
    break;
  case CALTYPE_ISLAMIC_CIVIL:
    pGVar1 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x268,(size_t)loc);
    local_1b8 = (GregorianCalendar *)0x0;
    if (pGVar1 != (GregorianCalendar *)0x0) {
      IslamicCalendar::IslamicCalendar((IslamicCalendar *)pGVar1,loc,status,CIVIL);
      local_1b8 = pGVar1;
    }
    local_28 = local_1b8;
    break;
  case CALTYPE_ISLAMIC:
  case CALTYPE_ISLAMIC_RGSA:
    pGVar1 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x268,(size_t)loc);
    local_1c8 = (GregorianCalendar *)0x0;
    if (pGVar1 != (GregorianCalendar *)0x0) {
      IslamicCalendar::IslamicCalendar((IslamicCalendar *)pGVar1,loc,status,ASTRONOMICAL);
      local_1c8 = pGVar1;
    }
    local_28 = local_1c8;
    break;
  case CALTYPE_HEBREW:
    pGVar1 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x268,(size_t)loc);
    local_1e8 = (GregorianCalendar *)0x0;
    if (pGVar1 != (GregorianCalendar *)0x0) {
      HebrewCalendar::HebrewCalendar((HebrewCalendar *)pGVar1,loc,status);
      local_1e8 = pGVar1;
    }
    local_28 = local_1e8;
    break;
  case CALTYPE_CHINESE:
    pGVar1 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x270,(size_t)loc);
    local_1f8 = (GregorianCalendar *)0x0;
    if (pGVar1 != (GregorianCalendar *)0x0) {
      ChineseCalendar::ChineseCalendar((ChineseCalendar *)pGVar1,loc,status);
      local_1f8 = pGVar1;
    }
    local_28 = local_1f8;
    break;
  case CALTYPE_INDIAN:
    pGVar1 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x268,(size_t)loc);
    local_208 = (GregorianCalendar *)0x0;
    if (pGVar1 != (GregorianCalendar *)0x0) {
      IndianCalendar::IndianCalendar((IndianCalendar *)pGVar1,loc,status);
      local_208 = pGVar1;
    }
    local_28 = local_208;
    break;
  case CALTYPE_COPTIC:
    pGVar1 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x268,(size_t)loc);
    local_218 = (GregorianCalendar *)0x0;
    if (pGVar1 != (GregorianCalendar *)0x0) {
      CopticCalendar::CopticCalendar((CopticCalendar *)pGVar1,loc,status);
      local_218 = pGVar1;
    }
    local_28 = local_218;
    break;
  case CALTYPE_ETHIOPIC:
    pGVar1 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x268,(size_t)loc);
    local_228 = (GregorianCalendar *)0x0;
    if (pGVar1 != (GregorianCalendar *)0x0) {
      EthiopicCalendar::EthiopicCalendar((EthiopicCalendar *)pGVar1,loc,status,AMETE_MIHRET_ERA);
      local_228 = pGVar1;
    }
    local_28 = local_228;
    break;
  case CALTYPE_ETHIOPIC_AMETE_ALEM:
    pGVar1 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x268,(size_t)loc);
    local_238 = (GregorianCalendar *)0x0;
    if (pGVar1 != (GregorianCalendar *)0x0) {
      EthiopicCalendar::EthiopicCalendar((EthiopicCalendar *)pGVar1,loc,status,AMETE_ALEM_ERA);
      local_238 = pGVar1;
    }
    local_28 = local_238;
    break;
  case CALTYPE_ISO8601:
    pGVar1 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x290,(size_t)loc);
    local_248 = (GregorianCalendar *)0x0;
    if (pGVar1 != (GregorianCalendar *)0x0) {
      GregorianCalendar::GregorianCalendar(pGVar1,loc,status);
      local_248 = pGVar1;
    }
    local_28 = local_248;
    Calendar::setFirstDayOfWeek(&local_248->super_Calendar,UCAL_MONDAY);
    Calendar::setMinimalDaysInFirstWeek(&local_248->super_Calendar,'\x04');
    break;
  case CALTYPE_DANGI:
    pGVar1 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x270,(size_t)loc);
    local_258 = (GregorianCalendar *)0x0;
    if (pGVar1 != (GregorianCalendar *)0x0) {
      DangiCalendar::DangiCalendar((DangiCalendar *)pGVar1,loc,status);
      local_258 = pGVar1;
    }
    local_28 = local_258;
    break;
  case CALTYPE_ISLAMIC_UMALQURA:
    pGVar1 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x268,(size_t)loc);
    local_1d8 = (GregorianCalendar *)0x0;
    if (pGVar1 != (GregorianCalendar *)0x0) {
      IslamicCalendar::IslamicCalendar((IslamicCalendar *)pGVar1,loc,status,UMALQURA);
      local_1d8 = pGVar1;
    }
    local_28 = local_1d8;
    break;
  case CALTYPE_ISLAMIC_TBLA:
    pGVar1 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x268,(size_t)loc);
    local_1a8 = (GregorianCalendar *)0x0;
    if (pGVar1 != (GregorianCalendar *)0x0) {
      IslamicCalendar::IslamicCalendar((IslamicCalendar *)pGVar1,loc,status,TBLA);
      local_1a8 = pGVar1;
    }
    local_28 = local_1a8;
    break;
  default:
    *status = U_UNSUPPORTED_ERROR;
  }
  return &local_28->super_Calendar;
}

Assistant:

static Calendar *createStandardCalendar(ECalType calType, const Locale &loc, UErrorCode& status) {
    Calendar *cal = NULL;

    switch (calType) {
        case CALTYPE_GREGORIAN:
            cal = new GregorianCalendar(loc, status);
            break;
        case CALTYPE_JAPANESE:
            cal = new JapaneseCalendar(loc, status);
            break;
        case CALTYPE_BUDDHIST:
            cal = new BuddhistCalendar(loc, status);
            break;
        case CALTYPE_ROC:
            cal = new TaiwanCalendar(loc, status);
            break;
        case CALTYPE_PERSIAN:
            cal = new PersianCalendar(loc, status);
            break;
        case CALTYPE_ISLAMIC_TBLA:
            cal = new IslamicCalendar(loc, status, IslamicCalendar::TBLA);
            break;
        case CALTYPE_ISLAMIC_CIVIL:
            cal = new IslamicCalendar(loc, status, IslamicCalendar::CIVIL);
            break;
        case CALTYPE_ISLAMIC_RGSA:
            // default any region specific not handled individually to islamic
        case CALTYPE_ISLAMIC:
            cal = new IslamicCalendar(loc, status, IslamicCalendar::ASTRONOMICAL);
            break;
        case CALTYPE_ISLAMIC_UMALQURA:
            cal = new IslamicCalendar(loc, status, IslamicCalendar::UMALQURA);
            break;
        case CALTYPE_HEBREW:
            cal = new HebrewCalendar(loc, status);
            break;
        case CALTYPE_CHINESE:
            cal = new ChineseCalendar(loc, status);
            break;
        case CALTYPE_INDIAN:
            cal = new IndianCalendar(loc, status);
            break;
        case CALTYPE_COPTIC:
            cal = new CopticCalendar(loc, status);
            break;
        case CALTYPE_ETHIOPIC:
            cal = new EthiopicCalendar(loc, status, EthiopicCalendar::AMETE_MIHRET_ERA);
            break;
        case CALTYPE_ETHIOPIC_AMETE_ALEM:
            cal = new EthiopicCalendar(loc, status, EthiopicCalendar::AMETE_ALEM_ERA);
            break;
        case CALTYPE_ISO8601:
            cal = new GregorianCalendar(loc, status);
            cal->setFirstDayOfWeek(UCAL_MONDAY);
            cal->setMinimalDaysInFirstWeek(4);
            break;
        case CALTYPE_DANGI:
            cal = new DangiCalendar(loc, status);
            break;
        default:
            status = U_UNSUPPORTED_ERROR;
    }
    return cal;
}